

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::cose::Sign1Message::Serialize
          (Error *__return_storage_ptr__,Sign1Message *this,ByteArray *aBuf)

{
  byte *rgb;
  size_t sVar1;
  
  sVar1 = COSE_Encode((HCOSE)this->mSign,(byte *)0x0,0,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aBuf,sVar1 + 1);
  rgb = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  sVar1 = COSE_Encode((HCOSE)this->mSign,rgb,0,
                      (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)rgb);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aBuf,sVar1);
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::Serialize(ByteArray &aBuf)
{
    size_t length;
    length = COSE_Encode(reinterpret_cast<HCOSE>(mSign), nullptr, 0, 0) + 1;
    aBuf.resize(length);
    length = COSE_Encode(reinterpret_cast<HCOSE>(mSign), aBuf.data(), 0, aBuf.size());
    aBuf.resize(length);

    return ERROR_NONE;
}